

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O1

void __thiscall
duckdb::LogManager::WriteLogEntry
          (LogManager *this,timestamp_t timestamp,char *log_type,LogLevel log_level,
          char *log_message,RegisteredLoggingContext *context)

{
  LogStorage *pLVar1;
  unique_lock<std::mutex> lck;
  allocator local_8a;
  allocator local_89;
  RegisteredLoggingContext *local_88;
  unique_lock<std::mutex> local_80;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_80._M_device = &this->lock;
  local_80._M_owns = false;
  local_88 = context;
  ::std::unique_lock<std::mutex>::lock(&local_80);
  local_80._M_owns = true;
  pLVar1 = shared_ptr<duckdb::LogStorage,_true>::operator->(&this->log_storage);
  ::std::__cxx11::string::string((string *)local_50,log_type,&local_89);
  ::std::__cxx11::string::string((string *)local_70,log_message,&local_8a);
  (*pLVar1->_vptr_LogStorage[2])(pLVar1,timestamp.value,(ulong)log_level,local_50,local_70,local_88)
  ;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_80);
  return;
}

Assistant:

void LogManager::WriteLogEntry(timestamp_t timestamp, const char *log_type, LogLevel log_level, const char *log_message,
                               const RegisteredLoggingContext &context) {
	unique_lock<mutex> lck(lock);
	log_storage->WriteLogEntry(timestamp, log_level, log_type, log_message, context);
}